

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall Lib::Stack<unsigned_int>::Stack(Stack<unsigned_int> *this,size_t initialCapacity)

{
  uint *puVar1;
  ulong uVar2;
  
  this->_capacity = initialCapacity;
  if (initialCapacity == 0) {
    puVar1 = (uint *)0x0;
  }
  else {
    uVar2 = initialCapacity * 4 + 0xf & 0xfffffffffffffff0;
    if (uVar2 == 0) {
      puVar1 = (uint *)FixedSizeAllocator<8UL>::alloc
                                 ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar2 < 0x11) {
      puVar1 = (uint *)FixedSizeAllocator<16UL>::alloc
                                 ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18)
                                 );
    }
    else if (uVar2 < 0x19) {
      puVar1 = (uint *)FixedSizeAllocator<24UL>::alloc
                                 ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30)
                                 );
    }
    else if (uVar2 < 0x21) {
      puVar1 = (uint *)FixedSizeAllocator<32UL>::alloc
                                 ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48)
                                 );
    }
    else if (uVar2 < 0x31) {
      puVar1 = (uint *)FixedSizeAllocator<48UL>::alloc
                                 ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60)
                                 );
    }
    else if (uVar2 < 0x41) {
      puVar1 = (uint *)FixedSizeAllocator<64UL>::alloc
                                 ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78)
                                 );
    }
    else {
      puVar1 = (uint *)::operator_new(uVar2,0x10);
    }
  }
  this->_stack = puVar1;
  this->_cursor = puVar1;
  this->_end = puVar1 + this->_capacity;
  return;
}

Assistant:

inline
  explicit Stack (size_t initialCapacity=0)
    : _capacity(initialCapacity)
  {
    if(_capacity) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),className());
      _stack = static_cast<C*>(mem);
    }
    else {
      _stack = nullptr;
    }
    _cursor = _stack;
    _end = _stack+_capacity;
  }